

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

SrcList * sqlite3SrcListAppendList(Parse *pParse,SrcList *p1,SrcList *p2)

{
  anon_struct_4_15_a1681e7a_for_fg *paVar1;
  SrcList *pSVar2;
  
  if (p2 != (SrcList *)0x0) {
    pSVar2 = sqlite3SrcListEnlarge(pParse,p1,p2->nSrc,1);
    if (pSVar2 == (SrcList *)0x0) {
      sqlite3SrcListDelete(pParse->db,p2);
    }
    else {
      memcpy(pSVar2 + 1,p2->a,(long)p2->nSrc * 0x68);
      sqlite3DbFreeNN(pParse->db,p2);
      paVar1 = &pSVar2->a[0].fg;
      paVar1->jointype = paVar1->jointype | (byte)pSVar2[1].a[0].regReturn & 0x40;
      p1 = pSVar2;
    }
  }
  return p1;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppendList(Parse *pParse, SrcList *p1, SrcList *p2){
  assert( p1 && p1->nSrc==1 );
  if( p2 ){
    SrcList *pNew = sqlite3SrcListEnlarge(pParse, p1, p2->nSrc, 1);
    if( pNew==0 ){
      sqlite3SrcListDelete(pParse->db, p2);
    }else{
      p1 = pNew;
      memcpy(&p1->a[1], p2->a, p2->nSrc*sizeof(SrcItem));
      sqlite3DbFree(pParse->db, p2);
      p1->a[0].fg.jointype |= (JT_LTORJ & p1->a[1].fg.jointype);
    }
  }
  return p1;
}